

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::copyAppend
          (QGenericArrayOps<QFileDialogPrivate::HistoryItem> *this,HistoryItem *b,HistoryItem *e)

{
  HistoryItem *pHVar1;
  Data *pDVar2;
  Data *pDVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pHVar1 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
    lVar4 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
    do {
      pDVar2 = (b->path).d.d;
      pHVar1[lVar4].path.d.d = pDVar2;
      pHVar1[lVar4].path.d.ptr = (b->path).d.ptr;
      pHVar1[lVar4].path.d.size = (b->path).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar3 = (b->selection).d.d;
      pHVar1[lVar4].selection.d.d = pDVar3;
      pHVar1[lVar4].selection.d.ptr = (b->selection).d.ptr;
      pHVar1[lVar4].selection.d.size = (b->selection).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar4 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size + 1;
      (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }